

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O2

void __thiscall
opengv::absolute_pose::modules::Epnp::fill_M
          (Epnp *this,MatrixXd *M,int row,double *as,double u,double v)

{
  long lVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  
  lVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  pdVar2 = (M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar3 = (long)(row + 1);
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    pdVar2[row] = as[lVar4] * this->fu;
    pdVar2[lVar1 + row] = 0.0;
    pdVar2[(long)row + lVar1 * 2] = (this->uc - u) * as[lVar4];
    pdVar2[lVar3] = 0.0;
    pdVar2[lVar1 + lVar3] = as[lVar4] * this->fv;
    pdVar2[lVar3 + lVar1 * 2] = (this->vc - v) * as[lVar4];
    pdVar2 = pdVar2 + lVar1 * 3;
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::fill_M(
    Eigen::MatrixXd & M,
    const int row,
    const double * as,
    const double u,
    const double v)
{
  for(int i = 0; i < 4; i++)
  {
    M(row,3*i) = as[i] * fu;
    M(row,3*i+1) = 0.0;
    M(row,3*i+2) = as[i] * (uc - u);

    M(row+1,3*i) = 0.0;
    M(row+1,3*i+1) = as[i] * fv;
    M(row+1,3*i+2) = as[i] * (vc - v);
  }
}